

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  GMM_PLATFORM_INFO *pGVar6;
  uint32_t NumSamples;
  int iVar7;
  anon_struct_8_44_94931171_for_Info aVar8;
  int iVar9;
  uint uVar10;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  GMM_PLATFORM_INFO *local_50;
  ulong local_48;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  
  pGVar6 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  CompressHeight._3_1_ =
       GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  uVar2 = pTexInfo->BaseHeight;
  local_38 = pTexInfo->MaxLod;
  local_48 = (ulong)(pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_60,&local_3c,&local_5c);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = (pTexInfo->MSAA).NumSamples;
  }
  uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar2,(uint32_t)local_48,uVar4);
  if (CompressHeight._3_1_ == '\0') {
    aVar1 = (pTexInfo->Flags).Gpu;
    if (((aVar1._0_4_ >> 0x1d & 1) != 0) && (((pTexInfo->Flags).Info.field_0x4 & 4) != 0)) {
      uVar3 = uVar2 >> 1;
      goto LAB_001a607b;
    }
    _CompressWidth = (ulong)(uVar2 >> 4);
    if ((~(ulong)aVar1 & 0x20000000002) != 0) {
      _CompressWidth = (ulong)uVar2;
    }
  }
  else {
    uVar3 = uVar2 / local_3c;
LAB_001a607b:
    _CompressWidth = (ulong)uVar3;
  }
  aVar8 = (pTexInfo->Flags).Info;
  if ((((ulong)aVar8 & 0x6000000000) != 0) &&
     (((pTexInfo->Alignment).MipTailStartLod == 0 || (pTexInfo->MaxLod == 0)))) goto LAB_001a624c;
  local_50 = pGVar6;
  if (local_38 == 0) {
    uVar2 = 0;
    uVar3 = 0;
    if (((ulong)aVar8 & 0x6000000000) == 0) {
LAB_001a623b:
      iVar9 = (int)_CompressWidth;
      iVar7 = (int)local_48;
      uVar3 = iVar7 + -1 + uVar2;
      goto LAB_001a6244;
    }
LAB_001a6207:
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = local_50->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    uVar3 = -uVar2 & (uVar2 - 1) + (int)_CompressWidth + uVar3;
  }
  else {
    uVar10 = 1;
    uVar2 = 0;
    uVar3 = 0;
    do {
      aVar8 = (pTexInfo->Flags).Info;
      if ((((ulong)aVar8 & 0x6000000000) != 0) && (uVar10 == (pTexInfo->Alignment).MipTailStartLod))
      {
        uVar4 = local_50->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        if (uVar10 == 1) {
          uVar2 = uVar4;
          uVar4 = 0;
        }
        uVar3 = uVar4 + uVar3;
        goto LAB_001a61f0;
      }
      uVar4 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])
                        (this,pTexInfo,(ulong)uVar10);
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
        NumSamples = 1;
      }
      else {
        NumSamples = (pTexInfo->MSAA).NumSamples;
      }
      uVar4 = GmmTextureCalc::ExpandHeight
                        (&this->super_GmmTextureCalc,uVar4,(uint32_t)local_48,NumSamples);
      if (CompressHeight._3_1_ == '\0') {
        aVar1 = (pTexInfo->Flags).Gpu;
        if (((aVar1._0_4_ >> 0x1d & 1) == 0) || (((ulong)(pTexInfo->Flags).Info & 0x400000000) == 0)
           ) {
          uVar5 = uVar4 >> 4;
          if ((~(ulong)aVar1 & 0x20000000002) != 0) {
            uVar5 = uVar4;
          }
        }
        else {
          uVar5 = uVar4 >> 1;
        }
      }
      else {
        uVar5 = uVar4 / local_3c;
      }
      uVar4 = uVar5;
      if (uVar10 == 1) {
        uVar4 = 0;
        uVar2 = uVar5;
      }
      uVar3 = uVar4 + uVar3;
      uVar10 = uVar10 + 1;
    } while (uVar10 <= local_38);
    aVar8 = (pTexInfo->Flags).Info;
LAB_001a61f0:
    iVar9 = (int)_CompressWidth;
    if (((ulong)aVar8 & 0x6000000000) != 0) goto LAB_001a6207;
    if (uVar3 <= uVar2) goto LAB_001a623b;
    iVar7 = (int)local_48;
    uVar3 = iVar7 + -1 + uVar3;
LAB_001a6244:
    uVar3 = (-iVar7 & uVar3) + iVar9;
  }
  _CompressWidth = (ulong)uVar3;
LAB_001a624c:
  return (uint32_t)_CompressWidth;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        HeightLinesLevel0 /= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        HeightLinesLevel0 /= 16;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }
                else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    AlignedHeightLines /= 2;
                }
                else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
                {
                    AlignedHeightLines /= 16;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}